

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O1

ssize_t __thiscall fmp4_stream::box::read(box *this,int __fd,void *__buf,size_t __nbytes)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  pointer __s;
  uint uVar1;
  uint32_t uVar2;
  int iVar3;
  uint *puVar4;
  pointer puVar5;
  int iVar6;
  size_t sVar7;
  ulong uVar8;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  undefined4 in_register_00000034;
  char *pcVar9;
  ulong uVar10;
  long *local_50 [2];
  long local_40 [2];
  
  pcVar9 = (char *)CONCAT44(in_register_00000034,__fd);
  this_00 = &this->box_data_;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,9);
  this->large_size_ = 0;
  std::istream::read(pcVar9,(long)(this->box_data_).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
  puVar4 = (uint *)(this->box_data_).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  uVar1 = *puVar4;
  this->size_ = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  *(undefined1 *)(puVar4 + 2) = 0;
  puVar5 = (this->box_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  __s = puVar5 + 4;
  local_50[0] = local_40;
  sVar7 = strlen((char *)__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,__s,puVar5 + sVar7 + 4);
  std::__cxx11::string::operator=((string *)&this->box_type_,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  iVar6 = std::__cxx11::string::compare((char *)&this->box_type_);
  if (iVar6 == 0) {
    this->has_uuid_ = true;
  }
  if ((ulong)this->size_ == 1) {
    this->is_large_ = true;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,0x10);
    std::istream::read(pcVar9,(long)((this->box_data_).
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 8));
    uVar8 = *(ulong *)((this->box_data_).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start + 8);
    uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
            (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
            (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
    this->large_size_ = uVar8;
  }
  else {
    this->large_size_ = (ulong)this->size_;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,8);
    uVar8 = extraout_RAX;
  }
  uVar2 = this->size_;
  if (uVar2 != 0) {
    iVar6 = *(int *)&(this->box_data_).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    iVar3 = *(int *)&(this->box_data_).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,this->large_size_);
    uVar10 = (ulong)(iVar6 - iVar3 & 0xff);
    uVar8 = extraout_RAX_00;
    if (this->large_size_ != uVar10) {
      uVar8 = std::istream::read(pcVar9,(long)((this_00->
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               )._M_impl.super__Vector_impl_data._M_start + uVar10))
      ;
    }
  }
  return CONCAT71((int7)(uVar8 >> 8),uVar2 != 0);
}

Assistant:

bool box::read(std::istream &istr)
	{
		box_data_.resize(9);
		large_size_ = 0;

		istr.read((char*)&box_data_[0], 8);
		size_ = fmp4_read_uint32((char *)&box_data_[0]);
		box_data_[8] = (uint8_t) '\0';
		box_type_ = std::string((char *)&box_data_[4]);
		if (box_type_.compare("uuid") == 0)
			has_uuid_ = true;

		// detect large size box 
		if (size_ == 1)
		{
			is_large_ = true;
			box_data_.resize(16);
			istr.read((char *)&box_data_[8], 8);
			large_size_ = fmp4_read_uint64((char *)&box_data_[8]);
		}
		else 
		{
			large_size_ = size_;
			box_data_.resize(8);
		}

		// read all the bytes from the stream
		if (size_) 
		{
			// write the offset bytes of the box
			uint8_t offset = (uint8_t)box_data_.size();
			box_data_.resize(large_size_);
			if ((large_size_ - offset) > 0)
				istr.read((char*)&box_data_[offset], large_size_ - offset);
			return true;
		}

		return false;
	}